

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

int __thiscall ON_BinaryArchive::Read3dmGroup(ON_BinaryArchive *this,ON_Group **ppGroup)

{
  ON_Object *pOVar1;
  bool bVar2;
  int iVar3;
  ON_ModelComponent *model_component;
  ON__UINT32 tcode;
  ON__INT64 big_value;
  uint local_34;
  ON_Object *local_30;
  ON__INT64 local_28;
  
  bVar2 = Read3dmTableRecord(this,group_table,ppGroup);
  if (!bVar2) {
    return 0;
  }
  local_34 = 0;
  local_28 = 0;
  bVar2 = BeginRead3dmBigChunk(this,&local_34,&local_28);
  if (!bVar2) {
    model_component = (ON_ModelComponent *)0x0;
    goto LAB_003a48fe;
  }
  if (local_34 == 0xffffffff) {
    model_component = (ON_ModelComponent *)0x0;
  }
  else {
    if (local_34 == 0x20008073) {
      Internal_Increment3dmTableItemCount(this);
      local_30 = (ON_Object *)0x0;
      iVar3 = ReadObjectHelper(this,&local_30);
      pOVar1 = local_30;
      if (iVar3 == 0) {
LAB_003a48cb:
        model_component = (ON_ModelComponent *)0x0;
      }
      else {
        model_component = &ON_Group::Cast(local_30)->super_ON_ModelComponent;
        if (model_component == (ON_ModelComponent *)0x0) {
          if (pOVar1 != (ON_Object *)0x0) {
            (*pOVar1->_vptr_ON_Object[4])(pOVar1);
          }
          goto LAB_003a48cb;
        }
        Internal_Read3dmUpdateManifest(this,model_component);
      }
      if (model_component != (ON_ModelComponent *)0x0) goto LAB_003a48f4;
      iVar3 = 0x28dc;
    }
    else {
      model_component = (ON_ModelComponent *)0x0;
      iVar3 = 0x28e0;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,iVar3,"","ON_BinaryArchive::Read3dmGroup() - corrupt group table");
  }
LAB_003a48f4:
  EndRead3dmChunk(this,false);
LAB_003a48fe:
  *ppGroup = (ON_Group *)model_component;
  return (uint)(model_component != (ON_ModelComponent *)0x0);
}

Assistant:

int ON_BinaryArchive::Read3dmGroup( ON_Group** ppGroup )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::group_table, (void**)ppGroup))
    return 0;

  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  ON_Group* group = nullptr;
  if ( BeginRead3dmBigChunk( &tcode, &big_value ) ) 
  {
    if ( tcode == TCODE_GROUP_RECORD ) 
    {
     Internal_Increment3dmTableItemCount();
      ON_Object* p = 0;
      if ( ReadObject( &p ) ) {
        group = ON_Group::Cast(p);
        if (!group)
          delete p;
        else
          Internal_Read3dmUpdateManifest(*group);
      }
      if (!group) {
        ON_ERROR("ON_BinaryArchive::Read3dmGroup() - corrupt group table");
      }
    }
    else if ( tcode != TCODE_ENDOFTABLE ) {
      ON_ERROR("ON_BinaryArchive::Read3dmGroup() - corrupt group table");
    }
    EndRead3dmChunk();
  }
  *ppGroup = group;
  return (group) ? 1 : 0;
}